

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int main(void)

{
  int iVar1;
  LIBSSH2_SESSION *session_00;
  bool bVar2;
  LIBSSH2_SESSION *session;
  int rc;
  int skipped;
  int retry;
  int retries;
  int exit_code;
  
  retries = 0;
  skipped = 0;
  rc = 0;
  while( true ) {
    session_00 = start_session_fixture((int *)((long)&session + 4),(int *)&session);
    if (session_00 == (LIBSSH2_SESSION *)0x0) {
      bVar2 = session._4_4_ == 0;
      if (!bVar2) {
        fprintf(_stderr,"Test skipped.\n");
      }
    }
    else {
      iVar1 = test(session_00);
      bVar2 = iVar1 != 0;
    }
    retry = (int)bVar2;
    stop_session_fixture();
    if ((retry == 0) || (rc = rc + 1, skipped < rc)) break;
    fprintf(_stderr,"Test failed (%d)! Retrying... %d / %d\n",(ulong)(uint)session,(ulong)(uint)rc,
            (ulong)(uint)skipped);
  }
  return retry;
}

Assistant:

int main(void)
{
    int exit_code;
    int retries = 0, retry = 0;

#ifdef LIBSSH2_WINCNG
    /* FIXME: Retry tests with WinCNG due to flakiness in hostkey
       verification: https://github.com/libssh2/libssh2/issues/804 */
    retries += 2;
#endif

    do {
        int skipped, rc;
        LIBSSH2_SESSION *session = start_session_fixture(&skipped, &rc);
        if(session) {
            exit_code = (test(session) == 0) ? 0 : 1;
        }
        else if(skipped) {
            fprintf(stderr, "Test skipped.\n");
            exit_code = 0;
        }
        else {
            exit_code = 1;
        }
        stop_session_fixture();
        if(exit_code == 0 ||
#ifdef LIBSSH2_WINCNG
           rc != LIBSSH2_ERROR_KEY_EXCHANGE_FAILURE ||
#endif
           ++retry > retries) {
            break;
        }
        fprintf(stderr, "Test failed (%d)! Retrying... %d / %d\n",
                        rc, retry, retries);
    } while(1);

    return exit_code;
}